

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O1

ON_3dVector * __thiscall
ON_Light::PerpindicularDirection(ON_3dVector *__return_storage_ptr__,ON_Light *this)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  ON_3dVector *pOVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ON_3dVector xdir;
  ON_3dVector dir;
  ON_3dVector ydir;
  ON_3dVector local_88;
  ON_3dVector local_68;
  ON_3dVector local_50;
  ON_3dVector local_38;
  
  local_68.z = (this->m_direction).z;
  local_68.x = (this->m_direction).x;
  local_68.y = (this->m_direction).y;
  bVar2 = ON_3dVector::IsValid(&local_68);
  if ((!bVar2) || (bVar2 = ON_3dVector::Unitize(&local_68), !bVar2)) {
    __return_storage_ptr__->z = ON_3dVector::UnsetVector.z;
    local_38.x._0_4_ = ON_3dVector::UnsetVector.x._0_4_;
    local_38.x._4_4_ = ON_3dVector::UnsetVector.x._4_4_;
    local_38.y._0_4_ = ON_3dVector::UnsetVector.y._0_4_;
    local_38.y._4_4_ = ON_3dVector::UnsetVector.y._4_4_;
    goto LAB_004cb7ed;
  }
  if (this->m_style - world_linear_light < 2) {
    local_88.z = (this->m_length).z;
    local_88.x = (this->m_length).x;
    local_88.y = (this->m_length).y;
    bVar2 = ON_3dVector::IsValid(&local_88);
    if (((bVar2) && (bVar2 = ON_3dVector::Unitize(&local_88), bVar2)) &&
       (dVar1 = ON_3dVector::operator*(&local_88,&local_68), ABS(dVar1) <= 1.490116119385e-08)) {
      __return_storage_ptr__->z = local_88.z;
      local_38.x._0_4_ = local_88.x._0_4_;
      local_38.x._4_4_ = local_88.x._4_4_;
      local_38.y._0_4_ = local_88.y._0_4_;
      local_38.y._4_4_ = local_88.y._4_4_;
      goto LAB_004cb7ed;
    }
  }
  iVar3 = ON_3dVector::IsParallelTo(&local_68,&ON_3dVector::ZAxis,0.05235987755982989);
  if (iVar3 == 0) {
    pOVar5 = &ON_3dVector::ZAxis;
  }
  else {
    pOVar5 = &ON_3dVector::XAxis;
  }
  ON_CrossProduct(&local_50,&local_68,pOVar5);
  local_88.z = local_50.z;
  local_88.x = local_50.x;
  local_88.y = local_50.y;
  ON_3dVector::Unitize(&local_88);
  ON_CrossProduct(&local_50,&local_68,&local_88);
  ON_3dVector::Unitize(&local_50);
  iVar3 = ON_3dVector::MaximumCoordinateIndex(&local_68);
  if (iVar3 - 1U < 2) {
    pOVar5 = &local_50;
    if (ABS(local_50.x) < ABS(local_88.x)) {
      pOVar5 = &local_88;
    }
    dVar1 = pOVar5->y;
    __return_storage_ptr__->x = pOVar5->x;
    __return_storage_ptr__->y = dVar1;
    __return_storage_ptr__->z = pOVar5->z;
    if (__return_storage_ptr__->x <= 0.0 && __return_storage_ptr__->x != 0.0) {
LAB_004cb8e9:
      ON_3dVector::operator-(&local_38,__return_storage_ptr__);
      __return_storage_ptr__->z = local_38.z;
      uVar6 = local_38.x._0_4_;
      uVar7 = local_38.x._4_4_;
      uVar8 = local_38.y._0_4_;
      uVar9 = local_38.y._4_4_;
LAB_004cb916:
      *(undefined4 *)&__return_storage_ptr__->x = uVar6;
      *(undefined4 *)((long)&__return_storage_ptr__->x + 4) = uVar7;
      *(undefined4 *)&__return_storage_ptr__->y = uVar8;
      *(undefined4 *)((long)&__return_storage_ptr__->y + 4) = uVar9;
    }
  }
  else {
    if (iVar3 != 0) {
      __return_storage_ptr__->z = local_88.z;
      uVar6 = local_88.x._0_4_;
      uVar7 = local_88.x._4_4_;
      uVar8 = local_88.y._0_4_;
      uVar9 = local_88.y._4_4_;
      goto LAB_004cb916;
    }
    pOVar5 = &local_50;
    if (ABS(local_50.y) < ABS(local_88.y)) {
      pOVar5 = &local_88;
    }
    dVar1 = pOVar5->y;
    __return_storage_ptr__->x = pOVar5->x;
    __return_storage_ptr__->y = dVar1;
    __return_storage_ptr__->z = pOVar5->z;
    if (__return_storage_ptr__->y <= 0.0 && __return_storage_ptr__->y != 0.0) goto LAB_004cb8e9;
  }
  iVar3 = ON_3dVector::MaximumCoordinateIndex(__return_storage_ptr__);
  pdVar4 = ON_3dVector::operator[](__return_storage_ptr__,iVar3);
  if (0.0 < *pdVar4 || *pdVar4 == 0.0) {
    return __return_storage_ptr__;
  }
  ON_3dVector::operator-(&local_38,__return_storage_ptr__);
  __return_storage_ptr__->z = local_38.z;
LAB_004cb7ed:
  *(undefined4 *)&__return_storage_ptr__->x = local_38.x._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->x + 4) = local_38.x._4_4_;
  *(undefined4 *)&__return_storage_ptr__->y = local_38.y._0_4_;
  *(undefined4 *)((long)&__return_storage_ptr__->y + 4) = local_38.y._4_4_;
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Light::PerpindicularDirection() const
{
  // returns a consistent vector perpendicular to the
  // light's direction.  This vector is useful for
  // user interface display.
  ON_3dVector dir = m_direction;
  if ( !dir.IsValid() || !dir.Unitize() )
    return ON_3dVector::UnsetVector;

  ON_3dVector xdir;
  if ( IsLinearLight() || IsRectangularLight() )
  {
    xdir = m_length;
    if ( xdir.IsValid() && xdir.Unitize() && fabs(xdir*dir) <= ON_SQRT_EPSILON )
      return xdir;
  }

  if( dir.IsParallelTo( ON_3dVector::ZAxis, ON_DEGREES_TO_RADIANS * 3.0))
    xdir = ON_CrossProduct( dir, ON_3dVector::XAxis);
  else
    xdir = ON_CrossProduct( dir, ON_3dVector::ZAxis);
  xdir.Unitize();
  ON_3dVector ydir = ON_CrossProduct(dir,xdir);
  ydir.Unitize();
  ON_3dVector right;

  switch(dir.MaximumCoordinateIndex())
  {
  case 0:
    right = (fabs(xdir.y) > fabs(ydir.y)) ? xdir : ydir;
    if (right.y < 0.0)
      right = -right;
    break;
  case 1:
  case 2:
    right = (fabs(xdir.x) > fabs(ydir.x)) ? xdir : ydir;
    if (right.x < 0.0)
      right = -right;
    break;
  default:
    right = xdir;
    break;
  }

  if (right[right.MaximumCoordinateIndex()] < 0.0)
    right = -right;

  return right;  
}